

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O2

Bytes __thiscall
Omega_h::prevent_coarsen_flip(Omega_h *this,Mesh *mesh,LOs *cands2edges,Bytes *cand_codes)

{
  Int IVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar2;
  Write<int> *this_00;
  Bytes BVar3;
  Write<signed_char> WStack_68;
  Write<signed_char> local_58;
  Write<int> local_48;
  Write<int> local_38;
  
  IVar1 = Mesh::dim(mesh);
  if (IVar1 == 3) {
    Write<int>::Write(&local_38,&cands2edges->write_);
    Write<signed_char>::Write(&local_58,&cand_codes->write_);
    prevent_coarsen_flip_dim<3>(this,mesh,(LOs *)&local_38,(Bytes *)&local_58);
    Write<signed_char>::~Write(&local_58);
    this_00 = &local_38;
  }
  else {
    IVar1 = Mesh::dim(mesh);
    if (IVar1 != 2) {
      Write<signed_char>::Write((Write<signed_char> *)this,&cand_codes->write_);
      pvVar2 = extraout_RDX_00;
      goto LAB_00371ba9;
    }
    Write<int>::Write(&local_48,&cands2edges->write_);
    Write<signed_char>::Write(&WStack_68,&cand_codes->write_);
    prevent_coarsen_flip_dim<2>(this,mesh,(LOs *)&local_48,(Bytes *)&WStack_68);
    Write<signed_char>::~Write(&WStack_68);
    this_00 = &local_48;
  }
  Write<int>::~Write(this_00);
  pvVar2 = extraout_RDX;
LAB_00371ba9:
  BVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  BVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar3.write_.shared_alloc_;
}

Assistant:

Bytes prevent_coarsen_flip(Mesh* mesh, LOs cands2edges, Bytes cand_codes) {
  if (mesh->dim() == 3) {
    return prevent_coarsen_flip_dim<3>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 2) {
    return prevent_coarsen_flip_dim<2>(mesh, cands2edges, cand_codes);
  }
  return cand_codes;
}